

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_squares_i16_64n_sse2(int16_t *src,uint32_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  void *pvVar17;
  uint64_t uVar18;
  ulong in_RSI;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  __m128i a;
  __m128i v_sum_d;
  __m128i v_sum_4567_d;
  __m128i v_sum_0123_d;
  __m128i v_sum_67_d;
  __m128i v_sum_45_d;
  __m128i v_sum_23_d;
  __m128i v_sum_01_d;
  __m128i v_sq_7_d;
  __m128i v_sq_6_d;
  __m128i v_sq_5_d;
  __m128i v_sq_4_d;
  __m128i v_sq_3_d;
  __m128i v_sq_2_d;
  __m128i v_sq_1_d;
  __m128i v_sq_0_d;
  __m128i v_val_7_w;
  __m128i v_val_6_w;
  __m128i v_val_5_w;
  __m128i v_val_4_w;
  __m128i v_val_3_w;
  __m128i v_val_2_w;
  __m128i v_val_1_w;
  __m128i v_val_0_w;
  int16_t *end;
  __m128i v_acc1_q;
  __m128i v_acc0_q;
  __m128i v_zext_mask_q;
  undefined8 local_300;
  
  pvVar17 = (void *)((long)in_RDI + (in_RSI & 0xffffffff) * 2);
  for (local_300 = in_RDI; local_300 < pvVar17; local_300 = (void *)((long)local_300 + 0x80)) {
    xx_load_128(local_300);
    xx_load_128((void *)((long)local_300 + 0x10));
    xx_load_128((void *)((long)local_300 + 0x20));
    xx_load_128((void *)((long)local_300 + 0x30));
    xx_load_128((void *)((long)local_300 + 0x40));
    xx_load_128((void *)((long)local_300 + 0x50));
    xx_load_128((void *)((long)local_300 + 0x60));
    in_RDI = (void *)((long)local_300 + 0x70);
    xx_load_128(in_RDI);
    auVar16._8_8_ = extraout_XMM0_Qb;
    auVar16._0_8_ = extraout_XMM0_Qa;
    auVar15._8_8_ = extraout_XMM0_Qb;
    auVar15._0_8_ = extraout_XMM0_Qa;
    pmaddwd(auVar16,auVar15);
    auVar14._8_8_ = extraout_XMM0_Qb_00;
    auVar14._0_8_ = extraout_XMM0_Qa_00;
    auVar13._8_8_ = extraout_XMM0_Qb_00;
    auVar13._0_8_ = extraout_XMM0_Qa_00;
    pmaddwd(auVar14,auVar13);
    auVar12._8_8_ = extraout_XMM0_Qb_01;
    auVar12._0_8_ = extraout_XMM0_Qa_01;
    auVar11._8_8_ = extraout_XMM0_Qb_01;
    auVar11._0_8_ = extraout_XMM0_Qa_01;
    pmaddwd(auVar12,auVar11);
    auVar10._8_8_ = extraout_XMM0_Qb_02;
    auVar10._0_8_ = extraout_XMM0_Qa_02;
    auVar9._8_8_ = extraout_XMM0_Qb_02;
    auVar9._0_8_ = extraout_XMM0_Qa_02;
    pmaddwd(auVar10,auVar9);
    auVar8._8_8_ = extraout_XMM0_Qb_03;
    auVar8._0_8_ = extraout_XMM0_Qa_03;
    auVar7._8_8_ = extraout_XMM0_Qb_03;
    auVar7._0_8_ = extraout_XMM0_Qa_03;
    pmaddwd(auVar8,auVar7);
    auVar6._8_8_ = extraout_XMM0_Qb_04;
    auVar6._0_8_ = extraout_XMM0_Qa_04;
    auVar5._8_8_ = extraout_XMM0_Qb_04;
    auVar5._0_8_ = extraout_XMM0_Qa_04;
    pmaddwd(auVar6,auVar5);
    auVar4._8_8_ = extraout_XMM0_Qb_05;
    auVar4._0_8_ = extraout_XMM0_Qa_05;
    auVar3._8_8_ = extraout_XMM0_Qb_05;
    auVar3._0_8_ = extraout_XMM0_Qa_05;
    pmaddwd(auVar4,auVar3);
    auVar2._8_8_ = extraout_XMM0_Qb_06;
    auVar2._0_8_ = extraout_XMM0_Qa_06;
    auVar1._8_8_ = extraout_XMM0_Qb_06;
    auVar1._0_8_ = extraout_XMM0_Qa_06;
    pmaddwd(auVar2,auVar1);
  }
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  uVar18 = xx_cvtsi128_si64(a);
  return uVar18;
}

Assistant:

static uint64_t aom_sum_squares_i16_64n_sse2(const int16_t *src, uint32_t n) {
  const __m128i v_zext_mask_q = _mm_set1_epi64x(~0u);
  __m128i v_acc0_q = _mm_setzero_si128();
  __m128i v_acc1_q = _mm_setzero_si128();

  const int16_t *const end = src + n;

  assert(n % 64 == 0);

  while (src < end) {
    const __m128i v_val_0_w = xx_load_128(src);
    const __m128i v_val_1_w = xx_load_128(src + 8);
    const __m128i v_val_2_w = xx_load_128(src + 16);
    const __m128i v_val_3_w = xx_load_128(src + 24);
    const __m128i v_val_4_w = xx_load_128(src + 32);
    const __m128i v_val_5_w = xx_load_128(src + 40);
    const __m128i v_val_6_w = xx_load_128(src + 48);
    const __m128i v_val_7_w = xx_load_128(src + 56);

    const __m128i v_sq_0_d = _mm_madd_epi16(v_val_0_w, v_val_0_w);
    const __m128i v_sq_1_d = _mm_madd_epi16(v_val_1_w, v_val_1_w);
    const __m128i v_sq_2_d = _mm_madd_epi16(v_val_2_w, v_val_2_w);
    const __m128i v_sq_3_d = _mm_madd_epi16(v_val_3_w, v_val_3_w);
    const __m128i v_sq_4_d = _mm_madd_epi16(v_val_4_w, v_val_4_w);
    const __m128i v_sq_5_d = _mm_madd_epi16(v_val_5_w, v_val_5_w);
    const __m128i v_sq_6_d = _mm_madd_epi16(v_val_6_w, v_val_6_w);
    const __m128i v_sq_7_d = _mm_madd_epi16(v_val_7_w, v_val_7_w);

    const __m128i v_sum_01_d = _mm_add_epi32(v_sq_0_d, v_sq_1_d);
    const __m128i v_sum_23_d = _mm_add_epi32(v_sq_2_d, v_sq_3_d);
    const __m128i v_sum_45_d = _mm_add_epi32(v_sq_4_d, v_sq_5_d);
    const __m128i v_sum_67_d = _mm_add_epi32(v_sq_6_d, v_sq_7_d);

    const __m128i v_sum_0123_d = _mm_add_epi32(v_sum_01_d, v_sum_23_d);
    const __m128i v_sum_4567_d = _mm_add_epi32(v_sum_45_d, v_sum_67_d);

    const __m128i v_sum_d = _mm_add_epi32(v_sum_0123_d, v_sum_4567_d);

    v_acc0_q = _mm_add_epi64(v_acc0_q, _mm_and_si128(v_sum_d, v_zext_mask_q));
    v_acc1_q = _mm_add_epi64(v_acc1_q, _mm_srli_epi64(v_sum_d, 32));

    src += 64;
  }

  v_acc0_q = _mm_add_epi64(v_acc0_q, v_acc1_q);
  v_acc0_q = _mm_add_epi64(v_acc0_q, _mm_srli_si128(v_acc0_q, 8));
  return xx_cvtsi128_si64(v_acc0_q);
}